

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int vm_builtin_json_decode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *zInput;
  ProcSort in_R8;
  ProcCmp in_R9;
  int nByte;
  json_decoder sDecoder;
  int local_cc;
  SySet local_c8;
  sxu32 local_9c;
  SyLex local_98;
  json_decoder local_58;
  
  if (((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) &&
     (zInput = jx9_value_to_string(*apArg,(int *)&local_9c), 0 < (int)local_9c)) {
    local_c8.pAllocator = &pCtx->pVm->sAllocator;
    local_98.sStream.pSet = &local_c8;
    local_c8.nUsed = 0;
    local_c8.nSize = 0;
    local_c8.eSize = 0x20;
    local_c8.nCursor = 0;
    local_c8.pBase = (SyToken *)0x0;
    local_c8.pUserData = (void *)0x0;
    local_cc = 0;
    local_98.xTokenizer = VmJsonTokenize;
    local_98.sStream.nLine = 1;
    local_98.sStream.nIgn = 0;
    local_98.sStream.zText = (uchar *)0x0;
    local_98.sStream.zEnd = (uchar *)0x0;
    local_98.pUserData = &local_cc;
    local_98.pTokenSet = local_98.sStream.pSet;
    SyLexTokenizeInput(&local_98,zInput,local_9c,VmJsonTokenize,in_R8,in_R9);
    if (local_cc == 0) {
      local_58.pIn = (SyToken *)local_c8.pBase;
      local_58.pEnd = (SyToken *)((long)local_c8.pBase + (local_c8._16_8_ & 0xffffffff) * 0x20);
      local_58.iFlags = 0;
      local_58.rec_count = 0;
      local_58.xConsumer = VmJsonDefaultDecoder;
      local_58.pUserData = (void *)0x0;
      local_58.pCtx = pCtx;
      local_58.pErr = &local_cc;
      local_cc = VmJsonDecode(&local_58,(jx9_value *)0x0);
      if (local_cc == -10) {
        jx9MemObjRelease(pCtx->pRet);
      }
      if ((jx9_vm *)local_c8.pAllocator == (jx9_vm *)0x0) {
        return 0;
      }
      if ((SyToken *)local_c8.pBase == (SyToken *)0x0) {
        return 0;
      }
      SyMemBackendFree(local_c8.pAllocator,local_c8.pBase);
      return 0;
    }
    if (((jx9_vm *)local_c8.pAllocator != (jx9_vm *)0x0) &&
       ((SyToken *)local_c8.pBase != (SyToken *)0x0)) {
      SyMemBackendFree(local_c8.pAllocator,local_c8.pBase);
    }
    local_c8.pBase = (void *)0x0;
    local_c8._16_8_ = local_c8._16_8_ & 0xffffffff00000000;
    local_c8._24_8_ = local_c8._24_8_ & 0xffffffff;
  }
  jx9MemObjRelease(pCtx->pRet);
  return 0;
}

Assistant:

static int vm_builtin_json_decode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zJSON;
	int nByte;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the JSON string */
	zJSON = jx9_value_to_string(apArg[0], &nByte);
	if( nByte < 1 ){
		/* Empty string, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Decode the raw JSON */
	jx9JsonDecode(pCtx,zJSON,nByte);
	return JX9_OK;
}